

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode *node,ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if ((node->field_0xba & 1) != 0) {
    StartMouseMovingWindow(window);
    IVar1.y = (pIVar2->IO).MouseClickedPos[0].y - (node->Pos).y;
    IVar1.x = (pIVar2->IO).MouseClickedPos[0].x - (node->Pos).x;
    pIVar2->ActiveIdClickOffset = IVar1;
    pIVar2->MovingWindow = window;
    node->field_0xba = node->field_0xba & 0xfe;
    return;
  }
  __assert_fail("node->WantMouseMove == true",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x325d,"void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode *, ImGuiWindow *)"
               );
}

Assistant:

static void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode* node, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->WantMouseMove == true);
    StartMouseMovingWindow(window);
    g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - node->Pos;
    g.MovingWindow = window; // If we are docked into a non moveable root window, StartMouseMovingWindow() won't set g.MovingWindow. Override that decision.
    node->WantMouseMove = false;
}